

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.h
# Opt level: O0

RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId> __thiscall
capnp::
makeRpcServer<capnproto_test::capnp::test::TestSturdyRefHostId,capnproto_test::capnp::test::TestThirdPartyCompletion,capnproto_test::capnp::test::TestThirdPartyToAwait,capnproto_test::capnp::test::TestThirdPartyToContact,capnproto_test::capnp::test::TestJoinResult>
          (capnp *this,
          VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>
          *network,Client *bootstrapInterface)

{
  Client *t;
  Impl *extraout_RDX;
  RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId> RVar1;
  Maybe<capnp::Capability::Client> local_38;
  Client *local_20;
  Client *bootstrapInterface_local;
  VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>
  *network_local;
  
  local_20 = bootstrapInterface;
  bootstrapInterface_local = (Client *)network;
  network_local =
       (VatNetwork<capnproto_test::capnp::test::TestSturdyRefHostId,_capnproto_test::capnp::test::TestThirdPartyCompletion,_capnproto_test::capnp::test::TestThirdPartyToAwait,_capnproto_test::capnp::test::TestThirdPartyToContact,_capnproto_test::capnp::test::TestJoinResult>
        *)this;
  t = kj::mv<capnp::Capability::Client>(bootstrapInterface);
  kj::Maybe<capnp::Capability::Client>::Maybe(&local_38,t);
  RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId>::
  RpcSystem<capnproto_test::capnp::test::TestThirdPartyCompletion,capnproto_test::capnp::test::TestThirdPartyToAwait,capnproto_test::capnp::test::TestThirdPartyToContact,capnproto_test::capnp::test::TestJoinResult>
            ((RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId> *)this,network,&local_38);
  kj::Maybe<capnp::Capability::Client>::~Maybe(&local_38);
  RVar1.super_RpcSystemBase.impl.ptr = extraout_RDX;
  RVar1.super_RpcSystemBase.impl.disposer = (Disposer *)this;
  return (RpcSystem<capnproto_test::capnp::test::TestSturdyRefHostId>)RVar1.super_RpcSystemBase.impl
  ;
}

Assistant:

RpcSystem<VatId> makeRpcServer(
    VatNetwork<VatId, ThirdPartyCompletion, ThirdPartyToAwait, ThirdPartyToContact,
               JoinResult>& network,
    Capability::Client bootstrapInterface) {
  return RpcSystem<VatId>(network, kj::mv(bootstrapInterface));
}